

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btSoftRigidDynamicsWorld::internalSingleStepSimulation
          (btSoftRigidDynamicsWorld *this,btScalar timeStep)

{
  btSoftBody *this_00;
  long lVar1;
  
  (*this->m_softBodySolver->_vptr_btSoftBodySolver[4])(this->m_softBodySolver,&this->m_softBodies,0)
  ;
  (*this->m_softBodySolver->_vptr_btSoftBodySolver[3])();
  btDiscreteDynamicsWorld::internalSingleStepSimulation
            (&this->super_btDiscreteDynamicsWorld,timeStep);
  solveSoftBodiesConstraints(this,timeStep);
  if (0 < (this->m_softBodies).m_size) {
    lVar1 = 0;
    do {
      this_00 = (this->m_softBodies).m_data[lVar1];
      btSoftBody::defaultCollisionHandler(this_00,this_00);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->m_softBodies).m_size);
  }
  (*this->m_softBodySolver->_vptr_btSoftBodySolver[8])();
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::internalSingleStepSimulation( btScalar timeStep )
{

	// Let the solver grab the soft bodies and if necessary optimize for it
	m_softBodySolver->optimize( getSoftBodyArray() );

	if( !m_softBodySolver->checkInitialized() )
	{
		btAssert( "Solver initialization failed\n" );
	}

	btDiscreteDynamicsWorld::internalSingleStepSimulation( timeStep );

	///solve soft bodies constraints
	solveSoftBodiesConstraints( timeStep );

	//self collisions
	for ( int i=0;i<m_softBodies.size();i++)
	{
		btSoftBody*	psb=(btSoftBody*)m_softBodies[i];
		psb->defaultCollisionHandler(psb);
	}

	///update soft bodies
	m_softBodySolver->updateSoftBodies( );
	
	// End solver-wise simulation step
	// ///////////////////////////////

}